

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O1

void __thiscall QtMWidgets::StepperPrivate::StepperPrivate(StepperPrivate *this,Stepper *parent)

{
  this->q = parent;
  this->minimum = 0;
  this->maximum = 99;
  this->value = 0;
  this->singleStep = 1;
  this->wrapping = false;
  this->autorepeat = true;
  (this->color).cspec = Invalid;
  (this->color).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->color).ct + 2) = 0;
  this->minusButtonEnabled = false;
  this->plusButtonEnabled = true;
  this->button = NoButton;
  this->timer = (QTimer *)0x0;
  this->timeout = 500;
  this->autorepeatCount = 0;
  init(this,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

StepperPrivate( Stepper * parent )
		:	q( parent )
		,	minimum( 0 )
		,	maximum( 99 )
		,	value( 0 )
		,	singleStep( 1 )
		,	wrapping( false )
		,	autorepeat( true )
		,	minusButtonEnabled( false )
		,	plusButtonEnabled( true )
		,	button( NoButton )
		,	timer( 0 )
		,	timeout( defaultTimeout )
		,	autorepeatCount( 0 )
	{
		init();
	}